

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2d(char *cval,double *dval,int *status)

{
  int *in_RDX;
  double *in_RSI;
  double *in_RDI;
  int lval;
  char msg [81];
  char sval [81];
  char dtype;
  int *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char local_21;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*in_RDX < 1) {
    if (*(char *)in_RDI == '\0') {
      *in_RDX = 0xcc;
      iVar1 = 0xcc;
    }
    else {
      ffdtyp((char *)in_stack_ffffffffffffff28,
             (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
      if ((local_21 == 'I') || (local_21 == 'F')) {
        ffc2dd((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               (int *)in_RSI);
      }
      else if (local_21 == 'L') {
        ffc2ll((char *)in_RDI,(int *)&stack0xffffffffffffff24,in_RDX);
        *in_RSI = (double)in_stack_ffffffffffffff24;
      }
      else if (local_21 == 'C') {
        ffc2s(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        ffc2dd((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               (int *)in_RSI);
      }
      else {
        *in_RDX = 0x196;
      }
      if (*in_RDX < 1) {
        iVar1 = *in_RDX;
      }
      else {
        *in_RSI = 0.0;
        strcpy(&stack0xffffffffffffff28,"Error in ffc2d evaluating string as a double: ");
        strncat(&stack0xffffffffffffff28,(char *)in_RDI,0x1e);
        ffpmsg((char *)0x17cde7);
        iVar1 = *in_RDX;
      }
    }
  }
  else {
    iVar1 = *in_RDX;
  }
  return iVar1;
}

Assistant:

int ffc2d(const char *cval,   /* I - string representation of the value */
          double *dval,       /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert formatted string to a double value, doing implicit
  datatype conversion if necessary
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */

    ffdtyp(cval, &dtype, status);     /* determine the datatype */

    if (dtype == 'I' || dtype == 'F')
        ffc2dd(cval, dval, status);
    else if (dtype == 'L')
    {
        ffc2ll(cval, &lval, status);
        *dval = (double) lval;
    }
    else if (dtype == 'C')
    {
        /* try reading the string as a number */
        ffc2s(cval, sval, status); 
        ffc2dd(sval, dval, status);
    }
    else 
        *status = BAD_DOUBLEKEY;

    if (*status > 0)
    {
            *dval = 0.;
            strcpy(msg,"Error in ffc2d evaluating string as a double: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }

    return(*status);
}